

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationBuilder::addTailComposites
          (CollationBuilder *this,UnicodeString *nfdPrefix,UnicodeString *nfdString,
          UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int32_t newCEsLength_00;
  uint32_t ce32_00;
  int iVar3;
  uint32_t ce32;
  int32_t newCEsLength;
  UChar32 composite;
  UnicodeSetIterator iter;
  int64_t newCEs [31];
  undefined1 local_158 [8];
  UnicodeString newString;
  UnicodeString newNFDString;
  UnicodeString decomp;
  undefined1 local_88 [8];
  UnicodeSet composites;
  int32_t indexAfterLastStarter;
  UChar32 lastStarter;
  UErrorCode *errorCode_local;
  UnicodeString *nfdString_local;
  UnicodeString *nfdPrefix_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    for (composites._80_4_ = UnicodeString::length(nfdString); composites._80_4_ != 0;
        composites._80_4_ = composites._80_4_ - iVar3) {
      composites._84_4_ = UnicodeString::char32At(nfdString,composites._80_4_ + -1);
      uVar2 = (*(this->nfd->super_UObject)._vptr_UObject[10])
                        (this->nfd,(ulong)(uint)composites._84_4_);
      if ((uVar2 & 0xff) == 0) {
        UVar1 = Hangul::isJamoL(composites._84_4_);
        if (UVar1 != '\0') {
          return;
        }
        UnicodeSet::UnicodeSet((UnicodeSet *)local_88);
        UVar1 = Normalizer2Impl::getCanonStartSet
                          (this->nfcImpl,composites._84_4_,(UnicodeSet *)local_88);
        if (UVar1 != '\0') {
          UnicodeString::UnicodeString((UnicodeString *)((long)&newNFDString.fUnion + 0x30));
          UnicodeString::UnicodeString((UnicodeString *)((long)&newString.fUnion + 0x30));
          UnicodeString::UnicodeString((UnicodeString *)local_158);
          UnicodeSetIterator::UnicodeSetIterator
                    ((UnicodeSetIterator *)&newCEsLength,(UnicodeSet *)local_88);
          while (UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)&newCEsLength),
                UVar1 != '\0') {
            uVar2 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)&newCEsLength);
            (*(this->nfd->super_UObject)._vptr_UObject[7])
                      (this->nfd,(ulong)uVar2,(undefined1 *)((long)&newNFDString.fUnion + 0x30));
            UVar1 = mergeCompositeIntoString
                              (this,nfdString,composites._80_4_,uVar2,
                               (UnicodeString *)((long)&newNFDString.fUnion + 0x30),
                               (UnicodeString *)((long)&newString.fUnion + 0x30),
                               (UnicodeString *)local_158,errorCode);
            if (((UVar1 != '\0') &&
                (newCEsLength_00 =
                      CollationDataBuilder::getCEs
                                (this->dataBuilder,nfdPrefix,
                                 (UnicodeString *)((long)&newString.fUnion + 0x30),
                                 (int64_t *)&iter.cpString,0), newCEsLength_00 < 0x20)) &&
               (ce32_00 = addIfDifferent(this,nfdPrefix,(UnicodeString *)local_158,
                                         (int64_t *)&iter.cpString,newCEsLength_00,0xffffffff,
                                         errorCode), ce32_00 != 0xffffffff)) {
              addOnlyClosure(this,nfdPrefix,(UnicodeString *)((long)&newString.fUnion + 0x30),
                             (int64_t *)&iter.cpString,newCEsLength_00,ce32_00,errorCode);
            }
          }
          UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)&newCEsLength);
          UnicodeString::~UnicodeString((UnicodeString *)local_158);
          UnicodeString::~UnicodeString((UnicodeString *)((long)&newString.fUnion + 0x30));
          UnicodeString::~UnicodeString((UnicodeString *)((long)&newNFDString.fUnion + 0x30));
        }
        UnicodeSet::~UnicodeSet((UnicodeSet *)local_88);
        return;
      }
      iVar3 = 2;
      if ((uint)composites._84_4_ < 0x10000) {
        iVar3 = 1;
      }
    }
  }
  return;
}

Assistant:

void
CollationBuilder::addTailComposites(const UnicodeString &nfdPrefix, const UnicodeString &nfdString,
                                    UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    // Look for the last starter in the NFD string.
    UChar32 lastStarter;
    int32_t indexAfterLastStarter = nfdString.length();
    for(;;) {
        if(indexAfterLastStarter == 0) { return; }  // no starter at all
        lastStarter = nfdString.char32At(indexAfterLastStarter - 1);
        if(nfd.getCombiningClass(lastStarter) == 0) { break; }
        indexAfterLastStarter -= U16_LENGTH(lastStarter);
    }
    // No closure to Hangul syllables since we decompose them on the fly.
    if(Hangul::isJamoL(lastStarter)) { return; }

    // Are there any composites whose decomposition starts with the lastStarter?
    // Note: Normalizer2Impl does not currently return start sets for NFC_QC=Maybe characters.
    // We might find some more equivalent mappings here if it did.
    UnicodeSet composites;
    if(!nfcImpl.getCanonStartSet(lastStarter, composites)) { return; }

    UnicodeString decomp;
    UnicodeString newNFDString, newString;
    int64_t newCEs[Collation::MAX_EXPANSION_LENGTH];
    UnicodeSetIterator iter(composites);
    while(iter.next()) {
        U_ASSERT(!iter.isString());
        UChar32 composite = iter.getCodepoint();
        nfd.getDecomposition(composite, decomp);
        if(!mergeCompositeIntoString(nfdString, indexAfterLastStarter, composite, decomp,
                                     newNFDString, newString, errorCode)) {
            continue;
        }
        int32_t newCEsLength = dataBuilder->getCEs(nfdPrefix, newNFDString, newCEs, 0);
        if(newCEsLength > Collation::MAX_EXPANSION_LENGTH) {
            // Ignore mappings that we cannot store.
            continue;
        }
        // Note: It is possible that the newCEs do not make use of the mapping
        // for which we are adding the tail composites, in which case we might be adding
        // unnecessary mappings.
        // For example, when we add tail composites for ae^ (^=combining circumflex),
        // UCA discontiguous-contraction matching does not find any matches
        // for ae_^ (_=any combining diacritic below) *unless* there is also
        // a contraction mapping for ae.
        // Thus, if there is no ae contraction, then the ae^ mapping is ignored
        // while fetching the newCEs for ae_^.
        // TODO: Try to detect this effectively.
        // (Alternatively, print a warning when prefix contractions are missing.)

        // We do not need an explicit mapping for the NFD strings.
        // It is fine if the NFD input collates like this via a sequence of mappings.
        // It also saves a little bit of space, and may reduce the set of characters with contractions.
        uint32_t ce32 = addIfDifferent(nfdPrefix, newString,
                                       newCEs, newCEsLength, Collation::UNASSIGNED_CE32, errorCode);
        if(ce32 != Collation::UNASSIGNED_CE32) {
            // was different, was added
            addOnlyClosure(nfdPrefix, newNFDString, newCEs, newCEsLength, ce32, errorCode);
        }
    }
}